

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Date * operator++(Date *date)

{
  Date *date_local;
  
  date->day = date->day + 1;
  if (0x1f < date->day) {
    date->month = date->month + 1;
    date->day = 1;
  }
  if (0xc < date->month) {
    date->year = date->year + 1;
    date->month = 1;
  }
  return date;
}

Assistant:

Date &operator++(Date &date) {
    date.day++;
    if (date.day > 31) {
        date.month++;
        date.day = 1;
    }
    if (date.month > 12) {
        date.year++;
        date.month = 1;
    }
    return date;
}